

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall Socket::Poll::Private::poll(Private *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  HashMap<Socket_*,_unsigned_int> *this_00;
  Socket **key;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  epoll_event *__events;
  epoll_event *peVar6;
  uint64 val;
  Private *local_340;
  Iterator it;
  
  this_00 = &this->selectedSockets;
  if ((this->selectedSockets).endItem.prev == (Item *)0x0) {
    __events = (epoll_event *)&it;
    local_340 = this;
    iVar4 = epoll_wait(this->fd,__events,0x40,(int)__nfds);
    puVar5 = (uint *)((long)iVar4 * 0xc);
    peVar6 = (epoll_event *)((long)&it + (long)puVar5);
    bVar2 = false;
    for (; __events < peVar6; __events = (epoll_event *)((long)&__events->data + 4)) {
      key = *(Socket ***)&__events->field_0x4;
      if (key == (Socket **)0x0) {
        puVar5 = (uint *)0x0;
        if ((__events->events & 1) != 0) {
          bVar2 = true;
        }
      }
      else {
        val._0_4_ = unmapEvents(__events->events,*(uint *)(key + 1));
        puVar5 = HashMap<Socket_*,_unsigned_int>::append(this_00,key,(uint *)&val);
      }
    }
    if ((local_340->selectedSockets).endItem.prev == (Item *)0x0) {
      if (bVar2) goto LAB_00108266;
    }
    else {
      this = local_340;
      if (!bVar2) goto LAB_0010819e;
LAB_00108266:
      puVar5 = (uint *)read(local_340->eventFd,&val,8);
      if (puVar5 != (uint *)0x8) {
        uVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Socket/Socket.cpp"
                              ,0x502,"read(eventFd, &val, sizeof(val)) == sizeof(val)");
        puVar5 = (uint *)(ulong)uVar3;
        if (uVar3 != 0) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
    }
    __fds->fd = 0;
    __fds[1].fd = 0;
    __fds[1].events = 0;
    __fds[1].revents = 0;
  }
  else {
LAB_0010819e:
    it.item = (this->selectedSockets)._begin.item;
    __fds[1] = (pollfd)(it.item)->key;
    __fds->fd = (it.item)->value;
    uVar3 = HashMap<Socket_*,_unsigned_int>::remove(this_00,(char *)&it);
    puVar5 = (uint *)(ulong)uVar3;
  }
  return (int)CONCAT71((int7)((ulong)puVar5 >> 8),1);
}

Assistant:

bool Socket::Poll::Private::poll(Event& event, int64 timeout)
{
  if(selectedSockets.isEmpty())
  {
    epoll_event events[64];
    int count = ::epoll_wait(fd, events, sizeof(events) / sizeof(*events), timeout);
    bool interrupted = false;
    for(epoll_event* i = events, * end = events + count; i < end; ++i)
    {
      Private::SocketInfo* sockInfo = (Private::SocketInfo*)i->data.ptr;
      if(sockInfo)
        selectedSockets.append(sockInfo->socket, unmapEvents(i->events, sockInfo->events));
      else if(i->events & EPOLLIN)
        interrupted = true;
    }

    if(selectedSockets.isEmpty() || interrupted)
    {
      if(interrupted)
      {
        uint64 val;
        VERIFY(read(eventFd, &val, sizeof(val)) == sizeof(val));
      }
      event.flags = 0;
      event.socket = 0;
      return true; // timeout or interrupt
    }
  }

  HashMap<Socket*, uint>::Iterator it = selectedSockets.begin();
  event.socket = it.key();
  event.flags = *it;
  selectedSockets.remove(it);
  return true;
}